

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  application application;
  
  std::operator<<((ostream *)&std::cout,"Autonomous Cabs Backend\n");
  ::application::application(&application);
  iVar1 = ::application::run(&application,argc,argv);
  ::application::~application(&application);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    std::cout << "Autonomous Cabs Backend\n";

    int return_value = 0;

    try
    {
        application application;
        return_value = application.run(argc, argv);
    }
    catch(std::exception& e)
    {
        std::cerr << "Critital error\n" << e.what() << std::endl;
        std::cerr << "Program terminated" << std::endl;

        return_value = -1;
    }

    return return_value;
}